

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O1

void __thiscall Item::ResetPosition(Item *this)

{
  uint uVar1;
  result_type_conflict1 rVar2;
  ostream *poVar3;
  uint uVar4;
  uniform_int_distribution<int> distribution_y;
  default_random_engine generator;
  uniform_int_distribution<int> distribution_x;
  random_device dev;
  uniform_int_distribution<int> local_13b0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a8;
  uniform_int_distribution<int> local_13a0;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  uVar4 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_13a8._M_x = (unsigned_long)(uVar4 + uVar1 + (uint)(uVar1 + uVar4 == 0));
  local_13a0._M_param._M_b = (this->super_GameObject).grid_width;
  local_13a0._M_param._M_a = 0;
  local_13b0._M_param._M_b = (this->super_GameObject).grid_height;
  local_13b0._M_param._M_a = 0;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_13a0,&local_13a8,&local_13a0._M_param);
  (this->super_GameObject).pos_x = (float)rVar2;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_13b0,&local_13a8,&local_13b0._M_param);
  (this->super_GameObject).pos_y = (float)rVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Position reset to x:",0x14);
  poVar3 = std::ostream::_M_insert<double>((double)(this->super_GameObject).pos_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," and y:",7);
  poVar3 = std::ostream::_M_insert<double>((double)(this->super_GameObject).pos_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::random_device::_M_fini();
  return;
}

Assistant:

void Item::ResetPosition()
 {
//reset the position of the object to one of the four sides of the screen randomly
  
  std::random_device dev;
  std::default_random_engine generator(dev());
  std::uniform_int_distribution<int> distribution_x(0,getGridWidth());
  std::uniform_int_distribution<int> distribution_y(0,getGridHeight());
  this->pos_x= distribution_x(generator);
  this->pos_y= distribution_y(generator);
  std::cout << "Position reset to x:" << pos_x << " and y:" << pos_y <<"\n";
  
 }